

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::anon_unknown_1::ConsoleAssertionPrinter::~ConsoleAssertionPrinter
          (ConsoleAssertionPrinter *this)

{
  pointer pcVar1;
  
  clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::~vector
            (&this->messages);
  pcVar1 = (this->message)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->message).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->messageLabel)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->messageLabel).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->passOrFail)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->passOrFail).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

ConsoleAssertionPrinter(ConsoleAssertionPrinter const&) = delete;